

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  undefined4 *puVar2;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar3;
  BVH *bvh;
  size_t sVar4;
  Geometry *pGVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  uint uVar20;
  int iVar21;
  AABBNodeMB4D *node1;
  ulong uVar22;
  ulong uVar23;
  undefined4 uVar24;
  QuadMesh *mesh;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  float *vertices1;
  long lVar31;
  vuint<4> *v;
  long lVar32;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar33;
  NodeRef root;
  NodeRef *pNVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar55;
  undefined1 in_ZMM0 [64];
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar70;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar68;
  float fVar69;
  undefined1 auVar67 [64];
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar90;
  float fVar97;
  vint4 ai;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar96;
  float fVar103;
  float fVar110;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  vint4 ai_1;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar117;
  float fVar128;
  float fVar129;
  vint4 ai_3;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar130;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar131;
  float fVar143;
  float fVar144;
  vint4 bi;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar145;
  undefined1 auVar142 [16];
  float fVar146;
  float fVar157;
  float fVar158;
  vint4 ai_2;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar159;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar160;
  float fVar172;
  float fVar173;
  vint4 bi_1;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar174;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar171;
  float fVar175;
  float fVar181;
  float fVar182;
  vint4 bi_3;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar183;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar184;
  float fVar187;
  float fVar188;
  vint4 bi_2;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar189;
  float fVar190;
  float fVar194;
  float fVar195;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar196;
  float fVar197;
  uint uVar200;
  uint uVar202;
  undefined1 auVar198 [16];
  float fVar201;
  float fVar203;
  uint uVar204;
  float fVar205;
  undefined1 auVar199 [16];
  float fVar206;
  float fVar210;
  float fVar211;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar212;
  undefined1 auVar209 [16];
  float fVar213;
  float fVar218;
  float fVar219;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar220;
  undefined1 auVar217 [16];
  float fVar221;
  undefined1 auVar222 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar223 [64];
  float fVar227;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar230 [64];
  vuint<4> *v_1;
  Precalculations pre;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined1 local_19b8 [8];
  float fStack_19b0;
  float fStack_19ac;
  undefined8 local_1998;
  undefined8 uStack_1990;
  vbool<4> terminated;
  Vec3<embree::vfloat_impl<4>_> p0;
  undefined1 local_18c8 [8];
  float fStack_18c0;
  float fStack_18bc;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined1 local_1868 [8];
  float fStack_1860;
  float fStack_185c;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar8 = mm_lookupmask_ps._240_16_;
  uVar19 = mm_lookupmask_ps._8_8_;
  uVar18 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar88 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar57 = vpcmpeqd_avx(auVar88,(undefined1  [16])valid_i->field_0);
    auVar36 = ZEXT816(0) << 0x40;
    auVar66 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar36,5);
    auVar54 = auVar57 & auVar66;
    if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar54[0xf] < '\0')
    {
      auVar66 = vandps_avx(auVar66,auVar57);
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar207._8_4_ = 0x7fffffff;
      auVar207._0_8_ = 0x7fffffff7fffffff;
      auVar207._12_4_ = 0x7fffffff;
      auVar57 = vandps_avx(auVar207,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar191._8_4_ = 0x219392ef;
      auVar191._0_8_ = 0x219392ef219392ef;
      auVar191._12_4_ = 0x219392ef;
      auVar57 = vcmpps_avx(auVar57,auVar191,1);
      auVar54 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar191,auVar57)
      ;
      auVar57 = vandps_avx(auVar207,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar57 = vcmpps_avx(auVar57,auVar191,1);
      auVar118 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar191,auVar57
                              );
      auVar57 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar207);
      auVar57 = vcmpps_avx(auVar57,auVar191,1);
      auVar57 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar191,auVar57)
      ;
      auVar119 = vrcpps_avx(auVar54);
      auVar192._8_4_ = 0x3f800000;
      auVar192._0_8_ = &DAT_3f8000003f800000;
      auVar192._12_4_ = 0x3f800000;
      auVar54 = vfnmadd213ps_fma(auVar54,auVar119,auVar192);
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)vfmadd132ps_fma(auVar54,auVar119,auVar119);
      auVar54 = vrcpps_avx(auVar118);
      auVar118 = vfnmadd213ps_fma(auVar118,auVar54,auVar192);
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)vfmadd132ps_fma(auVar118,auVar54,auVar54);
      auVar54 = vrcpps_avx(auVar57);
      auVar57 = vfnmadd213ps_fma(auVar57,auVar54,auVar192);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar57,auVar54,auVar54)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * *(float *)ray;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * *(float *)(ray + 4);
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * *(float *)(ray + 8);
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * *(float *)(ray + 0xc);
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      auVar57 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar36,1);
      auVar54._8_4_ = 0x10;
      auVar54._0_8_ = 0x1000000010;
      auVar54._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar57,auVar54);
      auVar57 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar36,5);
      auVar118._8_4_ = 0x20;
      auVar118._0_8_ = 0x2000000020;
      auVar118._12_4_ = 0x20;
      auVar132._8_4_ = 0x30;
      auVar132._0_8_ = 0x3000000030;
      auVar132._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar132,auVar118,auVar57);
      auVar57 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar36,5);
      auVar119._8_4_ = 0x40;
      auVar119._0_8_ = 0x4000000040;
      auVar119._12_4_ = 0x40;
      auVar133._8_4_ = 0x50;
      auVar133._0_8_ = 0x5000000050;
      auVar133._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar133,auVar119,auVar57);
      auVar57 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar36);
      auVar54 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar36);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar223 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar57,auVar66);
      auVar67 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar57._8_4_ = 0xff800000;
      auVar57._0_8_ = 0xff800000ff800000;
      auVar57._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar57,auVar54,auVar66);
      auVar89 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
      terminated.field_0.i[1] = auVar66._4_4_ ^ auVar88._4_4_;
      terminated.field_0.i[0] = auVar66._0_4_ ^ auVar88._0_4_;
      terminated.field_0.i[2] = auVar66._8_4_ ^ auVar88._8_4_;
      terminated.field_0.i[3] = auVar66._12_4_ ^ auVar88._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar29 = 3;
      }
      else {
        uVar29 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar34 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar33 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      do {
        paVar33 = paVar33 + -1;
        root.ptr = pNVar34[-1].ptr;
        pNVar34 = pNVar34 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00547a72:
          iVar21 = 3;
        }
        else {
          aVar3 = *paVar33;
          auVar88 = vcmpps_avx((undefined1  [16])aVar3,(undefined1  [16])tray.tfar.field_0,1);
          uVar20 = vmovmskps_avx(auVar88);
          if (uVar20 == 0) {
LAB_00547a83:
            iVar21 = 2;
          }
          else {
            uVar26 = (ulong)(uVar20 & 0xff);
            uVar20 = POPCOUNT(uVar20 & 0xff);
            iVar21 = 0;
            if (uVar20 <= uVar29) {
              do {
                sVar4 = 0;
                for (uVar22 = uVar26; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000)
                {
                  sVar4 = sVar4 + 1;
                }
                auVar67 = ZEXT1664(auVar67._0_16_);
                auVar89 = ZEXT1664(auVar89._0_16_);
                bVar35 = occluded1(This,bvh,root,sVar4,&pre,ray,&tray,context);
                if (bVar35) {
                  terminated.field_0.i[sVar4] = -1;
                }
                uVar26 = uVar26 - 1 & uVar26;
              } while (uVar26 != 0);
              auVar88 = vpcmpeqd_avx(auVar67._0_16_,auVar67._0_16_);
              auVar67 = ZEXT1664(auVar88);
              auVar88 = auVar88 & ~(undefined1  [16])terminated.field_0;
              iVar21 = 3;
              auVar223 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              if ((((auVar88 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar88 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar88 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar88[0xf] < '\0') {
                auVar67 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
                auVar88._8_4_ = 0xff800000;
                auVar88._0_8_ = 0xff800000ff800000;
                auVar88._12_4_ = 0xff800000;
                auVar89 = ZEXT1664(auVar88);
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar88,
                                   (undefined1  [16])terminated.field_0);
                iVar21 = 2;
              }
            }
            auVar230 = ZEXT1664((undefined1  [16])aVar3);
            if (uVar29 < uVar20) {
              do {
                uVar20 = (uint)root.ptr;
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_00547a72;
                  auVar88 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar230._0_16_,6);
                  if ((((auVar88 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar88 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar88 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar88[0xf] < '\0') {
                    uVar26 = (ulong)(uVar20 & 0xf);
                    auVar88 = vpcmpeqd_avx(auVar89._0_16_,auVar89._0_16_);
                    auVar89 = ZEXT1664(auVar88);
                    aVar55 = terminated.field_0;
                    if (uVar26 != 8) {
                      uVar22 = 0;
                      auVar88 = (undefined1  [16])terminated.field_0 ^ auVar88;
                      do {
                        lVar32 = uVar22 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                        uVar24 = vmovmskps_avx(auVar88);
                        uVar9 = 0;
                        uVar23 = CONCAT44((int)(uVar22 >> 0x20),uVar24);
                        for (uVar25 = uVar23; (uVar25 & 1) == 0;
                            uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                          uVar9 = uVar9 + 1;
                        }
                        auVar67 = ZEXT1664(auVar88);
                        uVar25 = 0;
                        while (auVar57 = auVar67._0_16_, *(int *)(lVar32 + 0x50 + uVar25 * 4) != -1)
                        {
                          pGVar5 = (context->scene->geometries).items
                                   [*(uint *)(lVar32 + 0x40 + uVar25 * 4)].ptr;
                          fVar77 = (pGVar5->time_range).lower;
                          auVar36._4_4_ = fVar77;
                          auVar36._0_4_ = fVar77;
                          auVar36._8_4_ = fVar77;
                          auVar36._12_4_ = fVar77;
                          fVar96 = pGVar5->fnumTimeSegments;
                          auVar54 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar36);
                          fVar77 = (pGVar5->time_range).upper - fVar77;
                          auVar37._4_4_ = fVar77;
                          auVar37._0_4_ = fVar77;
                          auVar37._8_4_ = fVar77;
                          auVar37._12_4_ = fVar77;
                          auVar54 = vdivps_avx(auVar54,auVar37);
                          auVar38._0_4_ = fVar96 * auVar54._0_4_;
                          auVar38._4_4_ = fVar96 * auVar54._4_4_;
                          auVar38._8_4_ = fVar96 * auVar54._8_4_;
                          auVar38._12_4_ = fVar96 * auVar54._12_4_;
                          auVar54 = vroundps_avx(auVar38,1);
                          fVar96 = fVar96 + -1.0;
                          auVar79._4_4_ = fVar96;
                          auVar79._0_4_ = fVar96;
                          auVar79._8_4_ = fVar96;
                          auVar79._12_4_ = fVar96;
                          auVar54 = vminps_avx(auVar54,auVar79);
                          auVar54 = vmaxps_avx(auVar54,_DAT_01feba10);
                          auVar36 = vsubps_avx(auVar38,auVar54);
                          itime.field_0 =
                               (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar54);
                          iVar21 = itime.field_0.i[uVar9];
                          auVar80._4_4_ = iVar21;
                          auVar80._0_4_ = iVar21;
                          auVar80._8_4_ = iVar21;
                          auVar80._12_4_ = iVar21;
                          auVar54 = vpcmpeqd_avx(auVar80,(undefined1  [16])itime.field_0);
                          auVar54 = auVar88 & ~auVar54;
                          fVar96 = auVar36._4_4_;
                          fVar103 = auVar36._8_4_;
                          fVar110 = auVar36._12_4_;
                          fVar77 = auVar36._0_4_;
                          if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               && (auVar54 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar54 >> 0x5f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) && -1 < auVar54[0xf]) {
                            lVar6 = *(long *)(*(long *)&pGVar5[2].numPrimitives +
                                             (long)iVar21 * 0x38);
                            lVar31 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 +
                                              (long)iVar21 * 0x38);
                            uVar27 = (ulong)*(uint *)(lVar32 + uVar25 * 4);
                            uVar30 = (ulong)*(uint *)(lVar32 + 0x10 + uVar25 * 4);
                            uVar24 = *(undefined4 *)(lVar6 + uVar27 * 4);
                            auVar136._4_4_ = uVar24;
                            auVar136._0_4_ = uVar24;
                            auVar136._8_4_ = uVar24;
                            auVar136._12_4_ = uVar24;
                            uVar24 = *(undefined4 *)(lVar6 + 4 + uVar27 * 4);
                            auVar150._4_4_ = uVar24;
                            auVar150._0_4_ = uVar24;
                            auVar150._8_4_ = uVar24;
                            auVar150._12_4_ = uVar24;
                            uVar24 = *(undefined4 *)(lVar6 + 8 + uVar27 * 4);
                            auVar162._4_4_ = uVar24;
                            auVar162._0_4_ = uVar24;
                            auVar162._8_4_ = uVar24;
                            auVar162._12_4_ = uVar24;
                            fVar56 = *(float *)(lVar31 + uVar27 * 4);
                            fVar68 = *(float *)(lVar31 + 4 + uVar27 * 4);
                            fVar69 = *(float *)(lVar31 + 8 + uVar27 * 4);
                            auVar58._8_4_ = 0x3f800000;
                            auVar58._0_8_ = &DAT_3f8000003f800000;
                            auVar58._12_4_ = 0x3f800000;
                            auVar54 = vsubps_avx(auVar58,auVar36);
                            auVar81._0_4_ = fVar77 * fVar56;
                            auVar81._4_4_ = fVar96 * fVar56;
                            auVar81._8_4_ = fVar103 * fVar56;
                            auVar81._12_4_ = fVar110 * fVar56;
                            auVar114._0_4_ = fVar77 * fVar68;
                            auVar114._4_4_ = fVar96 * fVar68;
                            auVar114._8_4_ = fVar103 * fVar68;
                            auVar114._12_4_ = fVar110 * fVar68;
                            auVar123._0_4_ = fVar77 * fVar69;
                            auVar123._4_4_ = fVar96 * fVar69;
                            auVar123._8_4_ = fVar103 * fVar69;
                            auVar123._12_4_ = fVar110 * fVar69;
                            auVar84 = vfmadd231ps_fma(auVar81,auVar54,auVar136);
                            auVar116 = vfmadd231ps_fma(auVar114,auVar54,auVar150);
                            auVar125 = vfmadd231ps_fma(auVar123,auVar54,auVar162);
                            uVar24 = *(undefined4 *)(lVar6 + uVar30 * 4);
                            auVar137._4_4_ = uVar24;
                            auVar137._0_4_ = uVar24;
                            auVar137._8_4_ = uVar24;
                            auVar137._12_4_ = uVar24;
                            uVar24 = *(undefined4 *)(lVar6 + 4 + uVar30 * 4);
                            auVar151._4_4_ = uVar24;
                            auVar151._0_4_ = uVar24;
                            auVar151._8_4_ = uVar24;
                            auVar151._12_4_ = uVar24;
                            uVar24 = *(undefined4 *)(lVar6 + 8 + uVar30 * 4);
                            auVar163._4_4_ = uVar24;
                            auVar163._0_4_ = uVar24;
                            auVar163._8_4_ = uVar24;
                            auVar163._12_4_ = uVar24;
                            fVar56 = *(float *)(lVar31 + uVar30 * 4);
                            fVar68 = *(float *)(lVar31 + 4 + uVar30 * 4);
                            fVar69 = *(float *)(lVar31 + 8 + uVar30 * 4);
                            auVar198._0_4_ = fVar56 * fVar77;
                            auVar198._4_4_ = fVar56 * fVar96;
                            auVar198._8_4_ = fVar56 * fVar103;
                            auVar198._12_4_ = fVar56 * fVar110;
                            auVar208._0_4_ = fVar68 * fVar77;
                            auVar208._4_4_ = fVar68 * fVar96;
                            auVar208._8_4_ = fVar68 * fVar103;
                            auVar208._12_4_ = fVar68 * fVar110;
                            auVar214._0_4_ = fVar69 * fVar77;
                            auVar214._4_4_ = fVar69 * fVar96;
                            auVar214._8_4_ = fVar69 * fVar103;
                            auVar214._12_4_ = fVar69 * fVar110;
                            auVar199 = vfmadd231ps_fma(auVar198,auVar54,auVar137);
                            auVar209 = vfmadd231ps_fma(auVar208,auVar54,auVar151);
                            auVar217 = vfmadd231ps_fma(auVar214,auVar54,auVar163);
                            uVar27 = (ulong)*(uint *)(lVar32 + 0x20 + uVar25 * 4);
                            uVar24 = *(undefined4 *)(lVar6 + uVar27 * 4);
                            auVar138._4_4_ = uVar24;
                            auVar138._0_4_ = uVar24;
                            auVar138._8_4_ = uVar24;
                            auVar138._12_4_ = uVar24;
                            uVar24 = *(undefined4 *)(lVar6 + 4 + uVar27 * 4);
                            auVar152._4_4_ = uVar24;
                            auVar152._0_4_ = uVar24;
                            auVar152._8_4_ = uVar24;
                            auVar152._12_4_ = uVar24;
                            uVar24 = *(undefined4 *)(lVar6 + 8 + uVar27 * 4);
                            auVar164._4_4_ = uVar24;
                            auVar164._0_4_ = uVar24;
                            auVar164._8_4_ = uVar24;
                            auVar164._12_4_ = uVar24;
                            fVar56 = *(float *)(lVar31 + uVar27 * 4);
                            fVar68 = *(float *)(lVar31 + 4 + uVar27 * 4);
                            fVar69 = *(float *)(lVar31 + 8 + uVar27 * 4);
                            auVar177._0_4_ = fVar56 * fVar77;
                            auVar177._4_4_ = fVar56 * fVar96;
                            auVar177._8_4_ = fVar56 * fVar103;
                            auVar177._12_4_ = fVar56 * fVar110;
                            auVar185._0_4_ = fVar68 * fVar77;
                            auVar185._4_4_ = fVar68 * fVar96;
                            auVar185._8_4_ = fVar68 * fVar103;
                            auVar185._12_4_ = fVar68 * fVar110;
                            auVar193._0_4_ = fVar69 * fVar77;
                            auVar193._4_4_ = fVar69 * fVar96;
                            auVar193._8_4_ = fVar69 * fVar103;
                            auVar193._12_4_ = fVar69 * fVar110;
                            _local_19b8 = vfmadd231ps_fma(auVar177,auVar54,auVar138);
                            _local_18c8 = vfmadd231ps_fma(auVar185,auVar54,auVar152);
                            _local_1868 = vfmadd231ps_fma(auVar193,auVar54,auVar164);
                            uVar27 = (ulong)*(uint *)(lVar32 + 0x30 + uVar25 * 4);
                            fVar56 = *(float *)(lVar31 + uVar27 * 4);
                            fVar68 = *(float *)(lVar31 + 4 + uVar27 * 4);
                            fVar69 = *(float *)(lVar31 + 8 + uVar27 * 4);
                            auVar139._0_4_ = fVar77 * fVar56;
                            auVar139._4_4_ = fVar96 * fVar56;
                            auVar139._8_4_ = fVar103 * fVar56;
                            auVar139._12_4_ = fVar110 * fVar56;
                            auVar153._0_4_ = fVar77 * fVar68;
                            auVar153._4_4_ = fVar96 * fVar68;
                            auVar153._8_4_ = fVar103 * fVar68;
                            auVar153._12_4_ = fVar110 * fVar68;
                            auVar165._0_4_ = fVar77 * fVar69;
                            auVar165._4_4_ = fVar96 * fVar69;
                            auVar165._8_4_ = fVar103 * fVar69;
                            auVar165._12_4_ = fVar110 * fVar69;
                            uVar24 = *(undefined4 *)(lVar6 + uVar27 * 4);
                            auVar39._4_4_ = uVar24;
                            auVar39._0_4_ = uVar24;
                            auVar39._8_4_ = uVar24;
                            auVar39._12_4_ = uVar24;
                            auVar167 = vfmadd231ps_fma(auVar139,auVar54,auVar39);
                            uVar24 = *(undefined4 *)(lVar6 + 4 + uVar27 * 4);
                            auVar40._4_4_ = uVar24;
                            auVar40._0_4_ = uVar24;
                            auVar40._8_4_ = uVar24;
                            auVar40._12_4_ = uVar24;
                            auVar155 = vfmadd231ps_fma(auVar153,auVar54,auVar40);
                            uVar24 = *(undefined4 *)(lVar6 + 8 + uVar27 * 4);
                            auVar41._4_4_ = uVar24;
                            auVar41._0_4_ = uVar24;
                            auVar41._8_4_ = uVar24;
                            auVar41._12_4_ = uVar24;
                            auVar168 = vfmadd231ps_fma(auVar165,auVar54,auVar41);
                          }
                          else {
                            if (uVar23 != 0) {
                              lVar6 = *(long *)&pGVar5[2].numPrimitives;
                              uVar28 = (ulong)*(uint *)(lVar32 + uVar25 * 4);
                              uVar30 = uVar23;
                              uVar27 = uVar9;
                              do {
                                lVar31 = (long)itime.field_0.i[uVar27] * 0x38;
                                auVar54 = *(undefined1 (*) [16])
                                           (*(long *)(lVar6 + lVar31) + uVar28 * 4);
                                puVar2 = (undefined4 *)
                                         (*(long *)(lVar6 + 0x38 + lVar31) + uVar28 * 4);
                                uVar11 = *puVar2;
                                uVar12 = puVar2[1];
                                uVar13 = puVar2[2];
                                *(int *)((long)&p0.field_0 + uVar27 * 4) = auVar54._0_4_;
                                uVar24 = vextractps_avx(auVar54,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar27 * 4 + 0x10) = uVar24;
                                uVar24 = vextractps_avx(auVar54,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar27 * 4 + 0x20) = uVar24;
                                *(undefined4 *)((long)&p1.field_0 + uVar27 * 4) = uVar11;
                                *(undefined4 *)((long)&p1.field_0 + uVar27 * 4 + 0x10) = uVar12;
                                *(undefined4 *)((long)&p1.field_0 + uVar27 * 4 + 0x20) = uVar13;
                                uVar30 = uVar30 ^ 1L << (uVar27 & 0x3f);
                                uVar27 = 0;
                                for (uVar10 = uVar30; (uVar10 & 1) == 0;
                                    uVar10 = uVar10 >> 1 | 0x8000000000000000) {
                                  uVar27 = uVar27 + 1;
                                }
                              } while (uVar30 != 0);
                            }
                            auVar61._8_4_ = 0x3f800000;
                            auVar61._0_8_ = &DAT_3f8000003f800000;
                            auVar61._12_4_ = 0x3f800000;
                            auVar54 = vsubps_avx(auVar61,auVar36);
                            fVar56 = auVar54._0_4_;
                            fVar71 = fVar56 * (float)p0.field_0._0_4_;
                            fVar68 = auVar54._4_4_;
                            fVar90 = fVar68 * (float)p0.field_0._4_4_;
                            fVar69 = auVar54._8_4_;
                            fVar97 = fVar69 * (float)p0.field_0._8_4_;
                            fVar70 = auVar54._12_4_;
                            fVar104 = fVar70 * (float)p0.field_0._12_4_;
                            fVar72 = fVar56 * (float)p0.field_0._16_4_;
                            fVar91 = fVar68 * (float)p0.field_0._20_4_;
                            fVar98 = fVar69 * (float)p0.field_0._24_4_;
                            fVar105 = fVar70 * (float)p0.field_0._28_4_;
                            fVar73 = fVar56 * (float)p0.field_0._32_4_;
                            fVar92 = fVar68 * (float)p0.field_0._36_4_;
                            fVar99 = fVar69 * (float)p0.field_0._40_4_;
                            fVar106 = fVar70 * (float)p0.field_0._44_4_;
                            fVar74 = fVar77 * (float)p1.field_0._0_4_;
                            fVar93 = fVar96 * (float)p1.field_0._4_4_;
                            fVar100 = fVar103 * (float)p1.field_0._8_4_;
                            fVar107 = fVar110 * (float)p1.field_0._12_4_;
                            fVar75 = fVar77 * (float)p1.field_0._16_4_;
                            fVar94 = fVar96 * (float)p1.field_0._20_4_;
                            fVar101 = fVar103 * (float)p1.field_0._24_4_;
                            fVar108 = fVar110 * (float)p1.field_0._28_4_;
                            fVar117 = fVar77 * (float)p1.field_0._32_4_;
                            fVar128 = fVar96 * (float)p1.field_0._36_4_;
                            fVar129 = fVar103 * (float)p1.field_0._40_4_;
                            fVar130 = fVar110 * (float)p1.field_0._44_4_;
                            if (uVar23 != 0) {
                              lVar6 = *(long *)&pGVar5[2].numPrimitives;
                              uVar28 = (ulong)*(uint *)(lVar32 + 0x10 + uVar25 * 4);
                              uVar30 = uVar23;
                              uVar27 = uVar9;
                              do {
                                lVar31 = (long)itime.field_0.i[uVar27] * 0x38;
                                auVar54 = *(undefined1 (*) [16])
                                           (*(long *)(lVar6 + lVar31) + uVar28 * 4);
                                auVar36 = *(undefined1 (*) [16])
                                           (*(long *)(lVar6 + 0x38 + lVar31) + uVar28 * 4);
                                *(int *)((long)&p0.field_0 + uVar27 * 4) = auVar54._0_4_;
                                uVar24 = vextractps_avx(auVar54,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar27 * 4 + 0x10) = uVar24;
                                uVar24 = vextractps_avx(auVar54,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar27 * 4 + 0x20) = uVar24;
                                *(int *)((long)&p1.field_0 + uVar27 * 4) = auVar36._0_4_;
                                uVar24 = vextractps_avx(auVar36,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar27 * 4 + 0x10) = uVar24;
                                uVar24 = vextractps_avx(auVar36,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar27 * 4 + 0x20) = uVar24;
                                uVar30 = uVar30 ^ 1L << (uVar27 & 0x3f);
                                uVar27 = 0;
                                for (uVar10 = uVar30; (uVar10 & 1) == 0;
                                    uVar10 = uVar10 >> 1 | 0x8000000000000000) {
                                  uVar27 = uVar27 + 1;
                                }
                              } while (uVar30 != 0);
                            }
                            fVar76 = fVar56 * (float)p0.field_0._0_4_;
                            fVar95 = fVar68 * (float)p0.field_0._4_4_;
                            fVar102 = fVar69 * (float)p0.field_0._8_4_;
                            fVar109 = fVar70 * (float)p0.field_0._12_4_;
                            fVar184 = fVar56 * (float)p0.field_0._16_4_;
                            fVar187 = fVar68 * (float)p0.field_0._20_4_;
                            fVar188 = fVar69 * (float)p0.field_0._24_4_;
                            fVar189 = fVar70 * (float)p0.field_0._28_4_;
                            fVar190 = fVar56 * (float)p0.field_0._32_4_;
                            fVar194 = fVar68 * (float)p0.field_0._36_4_;
                            fVar195 = fVar69 * (float)p0.field_0._40_4_;
                            fVar196 = fVar70 * (float)p0.field_0._44_4_;
                            fVar197 = fVar77 * (float)p1.field_0._0_4_;
                            fVar201 = fVar96 * (float)p1.field_0._4_4_;
                            fVar203 = fVar103 * (float)p1.field_0._8_4_;
                            fVar205 = fVar110 * (float)p1.field_0._12_4_;
                            fVar206 = fVar77 * (float)p1.field_0._16_4_;
                            fVar210 = fVar96 * (float)p1.field_0._20_4_;
                            fVar211 = fVar103 * (float)p1.field_0._24_4_;
                            fVar212 = fVar110 * (float)p1.field_0._28_4_;
                            fVar213 = fVar77 * (float)p1.field_0._32_4_;
                            fVar218 = fVar96 * (float)p1.field_0._36_4_;
                            fVar219 = fVar103 * (float)p1.field_0._40_4_;
                            fVar220 = fVar110 * (float)p1.field_0._44_4_;
                            if (uVar23 != 0) {
                              lVar6 = *(long *)&pGVar5[2].numPrimitives;
                              uVar28 = (ulong)*(uint *)(lVar32 + 0x20 + uVar25 * 4);
                              uVar30 = uVar23;
                              uVar27 = uVar9;
                              do {
                                lVar31 = (long)itime.field_0.i[uVar27] * 0x38;
                                auVar54 = *(undefined1 (*) [16])
                                           (*(long *)(lVar6 + lVar31) + uVar28 * 4);
                                auVar36 = *(undefined1 (*) [16])
                                           (*(long *)(lVar6 + 0x38 + lVar31) + uVar28 * 4);
                                *(int *)((long)&p0.field_0 + uVar27 * 4) = auVar54._0_4_;
                                uVar24 = vextractps_avx(auVar54,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar27 * 4 + 0x10) = uVar24;
                                uVar24 = vextractps_avx(auVar54,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar27 * 4 + 0x20) = uVar24;
                                *(int *)((long)&p1.field_0 + uVar27 * 4) = auVar36._0_4_;
                                uVar24 = vextractps_avx(auVar36,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar27 * 4 + 0x10) = uVar24;
                                uVar24 = vextractps_avx(auVar36,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar27 * 4 + 0x20) = uVar24;
                                uVar30 = uVar30 ^ 1L << (uVar27 & 0x3f);
                                uVar27 = 0;
                                for (uVar10 = uVar30; (uVar10 & 1) == 0;
                                    uVar10 = uVar10 >> 1 | 0x8000000000000000) {
                                  uVar27 = uVar27 + 1;
                                }
                              } while (uVar30 != 0);
                            }
                            fVar131 = fVar56 * (float)p0.field_0._0_4_;
                            fVar143 = fVar68 * (float)p0.field_0._4_4_;
                            fVar144 = fVar69 * (float)p0.field_0._8_4_;
                            fVar145 = fVar70 * (float)p0.field_0._12_4_;
                            fVar146 = fVar56 * (float)p0.field_0._16_4_;
                            fVar157 = fVar68 * (float)p0.field_0._20_4_;
                            fVar158 = fVar69 * (float)p0.field_0._24_4_;
                            fVar159 = fVar70 * (float)p0.field_0._28_4_;
                            fVar221 = fVar56 * (float)p0.field_0._32_4_;
                            fVar224 = fVar68 * (float)p0.field_0._36_4_;
                            fVar225 = fVar69 * (float)p0.field_0._40_4_;
                            fVar226 = fVar70 * (float)p0.field_0._44_4_;
                            fVar160 = fVar77 * (float)p1.field_0._0_4_;
                            fVar172 = fVar96 * (float)p1.field_0._4_4_;
                            fVar173 = fVar103 * (float)p1.field_0._8_4_;
                            fVar174 = fVar110 * (float)p1.field_0._12_4_;
                            fVar175 = fVar77 * (float)p1.field_0._16_4_;
                            fVar181 = fVar96 * (float)p1.field_0._20_4_;
                            fVar182 = fVar103 * (float)p1.field_0._24_4_;
                            fVar183 = fVar110 * (float)p1.field_0._28_4_;
                            fVar227 = fVar77 * (float)p1.field_0._32_4_;
                            fVar231 = fVar96 * (float)p1.field_0._36_4_;
                            fVar232 = fVar103 * (float)p1.field_0._40_4_;
                            fVar233 = fVar110 * (float)p1.field_0._44_4_;
                            if (uVar23 != 0) {
                              lVar6 = *(long *)&pGVar5[2].numPrimitives;
                              uVar28 = (ulong)*(uint *)(lVar32 + 0x30 + uVar25 * 4);
                              uVar30 = uVar23;
                              uVar27 = uVar9;
                              do {
                                lVar31 = (long)itime.field_0.i[uVar27] * 0x38;
                                auVar54 = *(undefined1 (*) [16])
                                           (*(long *)(lVar6 + lVar31) + uVar28 * 4);
                                auVar36 = *(undefined1 (*) [16])
                                           (*(long *)(lVar6 + 0x38 + lVar31) + uVar28 * 4);
                                *(int *)((long)&p0.field_0 + uVar27 * 4) = auVar54._0_4_;
                                uVar24 = vextractps_avx(auVar54,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar27 * 4 + 0x10) = uVar24;
                                uVar24 = vextractps_avx(auVar54,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar27 * 4 + 0x20) = uVar24;
                                *(int *)((long)&p1.field_0 + uVar27 * 4) = auVar36._0_4_;
                                uVar24 = vextractps_avx(auVar36,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar27 * 4 + 0x10) = uVar24;
                                uVar24 = vextractps_avx(auVar36,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar27 * 4 + 0x20) = uVar24;
                                uVar30 = uVar30 ^ 1L << (uVar27 & 0x3f);
                                uVar27 = 0;
                                for (uVar10 = uVar30; (uVar10 & 1) == 0;
                                    uVar10 = uVar10 >> 1 | 0x8000000000000000) {
                                  uVar27 = uVar27 + 1;
                                }
                              } while (uVar30 != 0);
                            }
                            auVar84._0_4_ = fVar74 + fVar71;
                            auVar84._4_4_ = fVar93 + fVar90;
                            auVar84._8_4_ = fVar100 + fVar97;
                            auVar84._12_4_ = fVar107 + fVar104;
                            auVar116._0_4_ = fVar75 + fVar72;
                            auVar116._4_4_ = fVar94 + fVar91;
                            auVar116._8_4_ = fVar101 + fVar98;
                            auVar116._12_4_ = fVar108 + fVar105;
                            auVar125._0_4_ = fVar117 + fVar73;
                            auVar125._4_4_ = fVar128 + fVar92;
                            auVar125._8_4_ = fVar129 + fVar99;
                            auVar125._12_4_ = fVar130 + fVar106;
                            auVar199._0_4_ = fVar197 + fVar76;
                            auVar199._4_4_ = fVar201 + fVar95;
                            auVar199._8_4_ = fVar203 + fVar102;
                            auVar199._12_4_ = fVar205 + fVar109;
                            auVar209._0_4_ = fVar184 + fVar206;
                            auVar209._4_4_ = fVar187 + fVar210;
                            auVar209._8_4_ = fVar188 + fVar211;
                            auVar209._12_4_ = fVar189 + fVar212;
                            auVar217._0_4_ = fVar190 + fVar213;
                            auVar217._4_4_ = fVar194 + fVar218;
                            auVar217._8_4_ = fVar195 + fVar219;
                            auVar217._12_4_ = fVar196 + fVar220;
                            local_19b8._4_4_ = fVar143 + fVar172;
                            local_19b8._0_4_ = fVar131 + fVar160;
                            fStack_19b0 = fVar144 + fVar173;
                            fStack_19ac = fVar145 + fVar174;
                            local_18c8._4_4_ = fVar181 + fVar157;
                            local_18c8._0_4_ = fVar175 + fVar146;
                            fStack_18c0 = fVar182 + fVar158;
                            fStack_18bc = fVar183 + fVar159;
                            local_1868._4_4_ = fVar224 + fVar231;
                            local_1868._0_4_ = fVar221 + fVar227;
                            fStack_1860 = fVar225 + fVar232;
                            fStack_185c = fVar226 + fVar233;
                            auVar167._0_4_ =
                                 fVar56 * (float)p0.field_0._0_4_ + fVar77 * (float)p1.field_0._0_4_
                            ;
                            auVar167._4_4_ =
                                 fVar68 * (float)p0.field_0._4_4_ + fVar96 * (float)p1.field_0._4_4_
                            ;
                            auVar167._8_4_ =
                                 fVar69 * (float)p0.field_0._8_4_ +
                                 fVar103 * (float)p1.field_0._8_4_;
                            auVar167._12_4_ =
                                 fVar70 * (float)p0.field_0._12_4_ +
                                 fVar110 * (float)p1.field_0._12_4_;
                            auVar155._0_4_ =
                                 fVar56 * (float)p0.field_0._16_4_ +
                                 fVar77 * (float)p1.field_0._16_4_;
                            auVar155._4_4_ =
                                 fVar68 * (float)p0.field_0._20_4_ +
                                 fVar96 * (float)p1.field_0._20_4_;
                            auVar155._8_4_ =
                                 fVar69 * (float)p0.field_0._24_4_ +
                                 fVar103 * (float)p1.field_0._24_4_;
                            auVar155._12_4_ =
                                 fVar70 * (float)p0.field_0._28_4_ +
                                 fVar110 * (float)p1.field_0._28_4_;
                            auVar168._0_4_ =
                                 fVar56 * (float)p0.field_0._32_4_ +
                                 fVar77 * (float)p1.field_0._32_4_;
                            auVar168._4_4_ =
                                 fVar68 * (float)p0.field_0._36_4_ +
                                 fVar96 * (float)p1.field_0._36_4_;
                            auVar168._8_4_ =
                                 fVar69 * (float)p0.field_0._40_4_ +
                                 fVar103 * (float)p1.field_0._40_4_;
                            auVar168._12_4_ =
                                 fVar70 * (float)p0.field_0._44_4_ +
                                 fVar110 * (float)p1.field_0._44_4_;
                          }
                          auVar119 = vsubps_avx(auVar84,auVar199);
                          auVar132 = vsubps_avx(auVar116,auVar209);
                          auVar133 = vsubps_avx(auVar125,auVar217);
                          auVar191 = vsubps_avx(auVar167,auVar84);
                          auVar192 = vsubps_avx(auVar155,auVar116);
                          auVar37 = vsubps_avx(auVar168,auVar125);
                          auVar140._0_4_ = auVar37._0_4_ * auVar132._0_4_;
                          auVar140._4_4_ = auVar37._4_4_ * auVar132._4_4_;
                          auVar140._8_4_ = auVar37._8_4_ * auVar132._8_4_;
                          auVar140._12_4_ = auVar37._12_4_ * auVar132._12_4_;
                          auVar39 = vfmsub231ps_fma(auVar140,auVar192,auVar133);
                          auVar154._0_4_ = auVar133._0_4_ * auVar191._0_4_;
                          auVar154._4_4_ = auVar133._4_4_ * auVar191._4_4_;
                          auVar154._8_4_ = auVar133._8_4_ * auVar191._8_4_;
                          auVar154._12_4_ = auVar133._12_4_ * auVar191._12_4_;
                          auVar40 = vfmsub231ps_fma(auVar154,auVar37,auVar119);
                          auVar166._0_4_ = auVar192._0_4_ * auVar119._0_4_;
                          auVar166._4_4_ = auVar192._4_4_ * auVar119._4_4_;
                          auVar166._8_4_ = auVar192._8_4_ * auVar119._8_4_;
                          auVar166._12_4_ = auVar192._12_4_ * auVar119._12_4_;
                          auVar38 = vsubps_avx(auVar84,*(undefined1 (*) [16])ray);
                          auVar79 = vsubps_avx(auVar116,*(undefined1 (*) [16])(ray + 0x10));
                          auVar84 = vfmsub231ps_fma(auVar166,auVar191,auVar132);
                          auVar80 = vsubps_avx(auVar125,*(undefined1 (*) [16])(ray + 0x20));
                          auVar54 = *(undefined1 (*) [16])(ray + 0x40);
                          auVar36 = *(undefined1 (*) [16])(ray + 0x50);
                          auVar118 = *(undefined1 (*) [16])(ray + 0x60);
                          auVar82._0_4_ = auVar79._0_4_ * auVar54._0_4_;
                          auVar82._4_4_ = auVar79._4_4_ * auVar54._4_4_;
                          auVar82._8_4_ = auVar79._8_4_ * auVar54._8_4_;
                          auVar82._12_4_ = auVar79._12_4_ * auVar54._12_4_;
                          auVar116 = vfmsub231ps_fma(auVar82,auVar38,auVar36);
                          auVar186._0_4_ = auVar84._0_4_ * auVar118._0_4_;
                          auVar186._4_4_ = auVar84._4_4_ * auVar118._4_4_;
                          auVar186._8_4_ = auVar84._8_4_ * auVar118._8_4_;
                          auVar186._12_4_ = auVar84._12_4_ * auVar118._12_4_;
                          auVar61 = vfmadd231ps_fma(auVar186,auVar40,auVar36);
                          auVar228._0_4_ = auVar36._0_4_ * auVar80._0_4_;
                          auVar228._4_4_ = auVar36._4_4_ * auVar80._4_4_;
                          auVar228._8_4_ = auVar36._8_4_ * auVar80._8_4_;
                          auVar228._12_4_ = auVar36._12_4_ * auVar80._12_4_;
                          auVar125 = vfmsub231ps_fma(auVar228,auVar79,auVar118);
                          auVar115._0_4_ = auVar38._0_4_ * auVar118._0_4_;
                          auVar115._4_4_ = auVar38._4_4_ * auVar118._4_4_;
                          auVar115._8_4_ = auVar38._8_4_ * auVar118._8_4_;
                          auVar115._12_4_ = auVar38._12_4_ * auVar118._12_4_;
                          auVar41 = vfmsub231ps_fma(auVar115,auVar80,auVar54);
                          auVar118 = vfmadd231ps_fma(auVar61,auVar39,auVar54);
                          auVar42._0_4_ = auVar37._0_4_ * auVar116._0_4_;
                          auVar42._4_4_ = auVar37._4_4_ * auVar116._4_4_;
                          auVar42._8_4_ = auVar37._8_4_ * auVar116._8_4_;
                          auVar42._12_4_ = auVar37._12_4_ * auVar116._12_4_;
                          auVar54 = vfmadd231ps_fma(auVar42,auVar41,auVar192);
                          auVar59._8_4_ = 0x80000000;
                          auVar59._0_8_ = 0x8000000080000000;
                          auVar59._12_4_ = 0x80000000;
                          auVar36 = vfmadd231ps_fma(auVar54,auVar125,auVar191);
                          auVar54 = vandps_avx(auVar118,auVar59);
                          uVar20 = auVar54._0_4_;
                          auVar215._0_4_ = (float)(uVar20 ^ auVar36._0_4_);
                          uVar200 = auVar54._4_4_;
                          auVar215._4_4_ = (float)(uVar200 ^ auVar36._4_4_);
                          uVar202 = auVar54._8_4_;
                          auVar215._8_4_ = (float)(uVar202 ^ auVar36._8_4_);
                          uVar204 = auVar54._12_4_;
                          auVar215._12_4_ = (float)(uVar204 ^ auVar36._12_4_);
                          auVar54 = vcmpps_avx(auVar215,_DAT_01feba10,5);
                          auVar67 = ZEXT1664(auVar57);
                          auVar36 = auVar57 & auVar54;
                          if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar36 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar36[0xf] < '\0') {
                            auVar54 = vandps_avx(auVar54,auVar57);
                            auVar44._0_4_ = auVar133._0_4_ * auVar116._0_4_;
                            auVar44._4_4_ = auVar133._4_4_ * auVar116._4_4_;
                            auVar44._8_4_ = auVar133._8_4_ * auVar116._8_4_;
                            auVar44._12_4_ = auVar133._12_4_ * auVar116._12_4_;
                            auVar36 = vfmadd213ps_fma(auVar132,auVar41,auVar44);
                            auVar36 = vfmadd213ps_fma(auVar119,auVar125,auVar36);
                            auVar179._0_4_ = (float)(uVar20 ^ auVar36._0_4_);
                            auVar179._4_4_ = (float)(uVar200 ^ auVar36._4_4_);
                            auVar179._8_4_ = (float)(uVar202 ^ auVar36._8_4_);
                            auVar179._12_4_ = (float)(uVar204 ^ auVar36._12_4_);
                            auVar36 = vcmpps_avx(auVar179,_DAT_01feba10,5);
                            auVar119 = auVar54 & auVar36;
                            if ((((auVar119 >> 0x1f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0 &&
                                 (auVar119 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 ) && (auVar119 >> 0x5f & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) && -1 < auVar119[0xf]) {
                              auVar67 = ZEXT1664(auVar57);
                            }
                            else {
                              auVar119 = vandps_avx(auVar118,auVar207);
                              auVar54 = vandps_avx(auVar54,auVar36);
                              auVar36 = vsubps_avx(auVar119,auVar215);
                              auVar36 = vcmpps_avx(auVar36,auVar179,5);
                              auVar132 = auVar54 & auVar36;
                              if ((((auVar132 >> 0x1f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0 ||
                                   (auVar132 >> 0x3f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar132 >> 0x5f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) || auVar132[0xf] < '\0') {
                                auVar54 = vandps_avx(auVar36,auVar54);
                                auVar46._0_4_ = auVar80._0_4_ * auVar84._0_4_;
                                auVar46._4_4_ = auVar80._4_4_ * auVar84._4_4_;
                                auVar46._8_4_ = auVar80._8_4_ * auVar84._8_4_;
                                auVar46._12_4_ = auVar80._12_4_ * auVar84._12_4_;
                                auVar36 = vfmadd132ps_fma(auVar79,auVar46,auVar40);
                                auVar36 = vfmadd132ps_fma(auVar38,auVar36,auVar39);
                                auVar126._0_4_ = (float)(uVar20 ^ auVar36._0_4_);
                                auVar126._4_4_ = (float)(uVar200 ^ auVar36._4_4_);
                                auVar126._8_4_ = (float)(uVar202 ^ auVar36._8_4_);
                                auVar126._12_4_ = (float)(uVar204 ^ auVar36._12_4_);
                                auVar47._0_4_ = auVar119._0_4_ * *(float *)(ray + 0x30);
                                auVar47._4_4_ = auVar119._4_4_ * *(float *)(ray + 0x34);
                                auVar47._8_4_ = auVar119._8_4_ * *(float *)(ray + 0x38);
                                auVar47._12_4_ = auVar119._12_4_ * *(float *)(ray + 0x3c);
                                auVar36 = vcmpps_avx(auVar47,auVar126,1);
                                auVar133 = *(undefined1 (*) [16])(ray + 0x80);
                                auVar62._0_4_ = auVar119._0_4_ * *(float *)(ray + 0x80);
                                auVar62._4_4_ = auVar119._4_4_ * *(float *)(ray + 0x84);
                                auVar62._8_4_ = auVar119._8_4_ * *(float *)(ray + 0x88);
                                auVar62._12_4_ = auVar119._12_4_ * *(float *)(ray + 0x8c);
                                auVar132 = vcmpps_avx(auVar126,auVar62,2);
                                auVar36 = vandps_avx(auVar132,auVar36);
                                auVar132 = auVar54 & auVar36;
                                if ((((auVar132 >> 0x1f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar132 >> 0x3f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar132 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar132[0xf] < '\0') {
                                  auVar54 = vandps_avx(auVar36,auVar54);
                                  auVar36 = vcmpps_avx(auVar118,_DAT_01feba10,4);
                                  auVar118 = auVar54 & auVar36;
                                  if ((((auVar118 >> 0x1f & (undefined1  [16])0x1) !=
                                        (undefined1  [16])0x0 ||
                                       (auVar118 >> 0x3f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                      (auVar118 >> 0x5f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) || auVar118[0xf] < '\0') {
                                    auVar54 = vandps_avx(auVar36,auVar54);
                                    uVar20 = pGVar5->mask;
                                    auVar48._4_4_ = uVar20;
                                    auVar48._0_4_ = uVar20;
                                    auVar48._8_4_ = uVar20;
                                    auVar48._12_4_ = uVar20;
                                    auVar36 = vpand_avx(auVar48,*(undefined1 (*) [16])(ray + 0x90));
                                    auVar36 = vpcmpeqd_avx(auVar36,_DAT_01feba10);
                                    auVar118 = auVar54 & ~auVar36;
                                    if ((((auVar118 >> 0x1f & (undefined1  [16])0x1) !=
                                          (undefined1  [16])0x0 ||
                                         (auVar118 >> 0x3f & (undefined1  [16])0x1) !=
                                         (undefined1  [16])0x0) ||
                                        (auVar118 >> 0x5f & (undefined1  [16])0x1) !=
                                        (undefined1  [16])0x0) || auVar118[0xf] < '\0') {
                                      aVar171 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                                vandnps_avx(auVar36,auVar54);
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        auVar54 = vrcpps_avx(auVar119);
                                        auVar170._8_4_ = 0x3f800000;
                                        auVar170._0_8_ = &DAT_3f8000003f800000;
                                        auVar170._12_4_ = 0x3f800000;
                                        auVar36 = vfnmadd213ps_fma(auVar119,auVar54,auVar170);
                                        auVar54 = vfmadd132ps_fma(auVar36,auVar54,auVar54);
                                        fVar77 = auVar54._0_4_;
                                        auVar52._0_4_ = auVar215._0_4_ * fVar77;
                                        fVar96 = auVar54._4_4_;
                                        auVar52._4_4_ = auVar215._4_4_ * fVar96;
                                        fVar103 = auVar54._8_4_;
                                        auVar52._8_4_ = auVar215._8_4_ * fVar103;
                                        fVar110 = auVar54._12_4_;
                                        auVar52._12_4_ = auVar215._12_4_ * fVar110;
                                        auVar54 = vminps_avx(auVar52,auVar170);
                                        auVar63._0_4_ = auVar179._0_4_ * fVar77;
                                        auVar63._4_4_ = auVar179._4_4_ * fVar96;
                                        auVar63._8_4_ = auVar179._8_4_ * fVar103;
                                        auVar63._12_4_ = auVar179._12_4_ * fVar110;
                                        auVar36 = vminps_avx(auVar63,auVar170);
                                        auVar118 = vsubps_avx(auVar170,auVar54);
                                        auVar119 = vsubps_avx(auVar170,auVar36);
                                        auVar14._8_8_ = uVar19;
                                        auVar14._0_8_ = uVar18;
                                        auVar54 = vblendvps_avx(auVar54,auVar118,auVar14);
                                        vblendvps_avx(auVar36,auVar119,auVar14);
                                        local_1888 = auVar39._0_8_;
                                        uStack_1880 = auVar39._8_8_;
                                        p0.field_0._0_8_ = local_1888;
                                        p0.field_0._8_8_ = uStack_1880;
                                        local_1898 = auVar40._0_8_;
                                        uStack_1890 = auVar40._8_8_;
                                        p0.field_0._16_8_ = local_1898;
                                        p0.field_0._24_8_ = uStack_1890;
                                        local_18a8 = auVar84._0_8_;
                                        uStack_18a0 = auVar84._8_8_;
                                        p0.field_0._32_8_ = local_18a8;
                                        p0.field_0._40_8_ = uStack_18a0;
                                        vpcmpeqd_avx2(ZEXT1632(auVar54),ZEXT1632(auVar54));
                                        auVar64._0_4_ = fVar77 * auVar126._0_4_;
                                        auVar64._4_4_ = fVar96 * auVar126._4_4_;
                                        auVar64._8_4_ = fVar103 * auVar126._8_4_;
                                        auVar64._12_4_ = fVar110 * auVar126._12_4_;
                                        auVar54 = vblendvps_avx(auVar133,auVar64,
                                                                (undefined1  [16])aVar171);
                                        *(undefined1 (*) [16])(ray + 0x80) = auVar54;
                                        itime.field_0 = aVar171;
                                        p1.field_0._0_8_ = &itime;
                                        p1.field_0._8_8_ = pGVar5->userPtr;
                                        p1.field_0._16_8_ = context->user;
                                        p1.field_0._24_8_ = ray;
                                        p1.field_0._32_8_ = &p0;
                                        p1.field_0._40_4_ = 4;
                                        if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                          (*pGVar5->occlusionFilterN)
                                                    ((RTCFilterFunctionNArguments *)&p1);
                                        }
                                        if (itime.field_0 ==
                                            (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                          auVar54 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10
                                                                );
                                          auVar54 = auVar54 ^ _DAT_01febe20;
                                        }
                                        else {
                                          p_Var7 = context->args->filter;
                                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                            (*p_Var7)((RTCFilterFunctionNArguments *)&p1);
                                          }
                                          auVar36 = vpcmpeqd_avx((undefined1  [16])0x0,
                                                                 (undefined1  [16])itime.field_0);
                                          auVar54 = auVar36 ^ _DAT_01febe20;
                                          auVar85._8_4_ = 0xff800000;
                                          auVar85._0_8_ = 0xff800000ff800000;
                                          auVar85._12_4_ = 0xff800000;
                                          auVar36 = vblendvps_avx(auVar85,*(undefined1 (*) [16])
                                                                           (p1.field_0._24_8_ + 0x80
                                                                           ),auVar36);
                                          *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar36
                                          ;
                                        }
                                        auVar54 = vpslld_avx(auVar54,0x1f);
                                        aVar171 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                                  vpsrad_avx(auVar54,0x1f);
                                        auVar54 = vblendvps_avx(auVar133,*(undefined1 (*) [16])
                                                                          pRVar1,auVar54);
                                        *(undefined1 (*) [16])pRVar1 = auVar54;
                                      }
                                      auVar57 = vpandn_avx((undefined1  [16])aVar171,auVar57);
                                    }
                                  }
                                }
                              }
                              auVar67 = ZEXT1664(auVar57);
                            }
                          }
                          auVar57 = auVar67._0_16_;
                          if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               && (auVar57 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar57 >> 0x5f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) && -1 < auVar67[0xf]) {
                            bVar35 = false;
                            auVar223 = ZEXT1664(CONCAT412(0x7f800000,
                                                          CONCAT48(0x7f800000,0x7f8000007f800000)));
                            auVar57 = vpcmpeqd_avx(auVar209,auVar209);
                            auVar89 = ZEXT1664(auVar57);
                          }
                          else {
                            auVar119 = vsubps_avx(_local_19b8,auVar167);
                            auVar132 = vsubps_avx(_local_18c8,auVar155);
                            auVar133 = vsubps_avx(_local_1868,auVar168);
                            auVar191 = vsubps_avx(auVar199,_local_19b8);
                            auVar192 = vsubps_avx(auVar209,_local_18c8);
                            auVar37 = vsubps_avx(auVar217,_local_1868);
                            auVar60._0_4_ = auVar37._0_4_ * auVar132._0_4_;
                            auVar60._4_4_ = auVar37._4_4_ * auVar132._4_4_;
                            auVar60._8_4_ = auVar37._8_4_ * auVar132._8_4_;
                            auVar60._12_4_ = auVar37._12_4_ * auVar132._12_4_;
                            auVar84 = vfmsub231ps_fma(auVar60,auVar192,auVar133);
                            auVar83._0_4_ = auVar133._0_4_ * auVar191._0_4_;
                            auVar83._4_4_ = auVar133._4_4_ * auVar191._4_4_;
                            auVar83._8_4_ = auVar133._8_4_ * auVar191._8_4_;
                            auVar83._12_4_ = auVar133._12_4_ * auVar191._12_4_;
                            auVar116 = vfmsub231ps_fma(auVar83,auVar37,auVar119);
                            auVar141._0_4_ = auVar192._0_4_ * auVar119._0_4_;
                            auVar141._4_4_ = auVar192._4_4_ * auVar119._4_4_;
                            auVar141._8_4_ = auVar192._8_4_ * auVar119._8_4_;
                            auVar141._12_4_ = auVar192._12_4_ * auVar119._12_4_;
                            auVar38 = vsubps_avx(_local_19b8,*(undefined1 (*) [16])ray);
                            auVar79 = vsubps_avx(_local_18c8,*(undefined1 (*) [16])(ray + 0x10));
                            auVar80 = vsubps_avx(_local_1868,*(undefined1 (*) [16])(ray + 0x20));
                            auVar125 = vfmsub231ps_fma(auVar141,auVar191,auVar132);
                            auVar54 = *(undefined1 (*) [16])(ray + 0x40);
                            auVar36 = *(undefined1 (*) [16])(ray + 0x50);
                            auVar216._0_4_ = auVar54._0_4_ * auVar79._0_4_;
                            auVar216._4_4_ = auVar54._4_4_ * auVar79._4_4_;
                            auVar216._8_4_ = auVar54._8_4_ * auVar79._8_4_;
                            auVar216._12_4_ = auVar54._12_4_ * auVar79._12_4_;
                            auVar199 = vfmsub231ps_fma(auVar216,auVar38,auVar36);
                            auVar118 = *(undefined1 (*) [16])(ray + 0x60);
                            auVar178._0_4_ = auVar118._0_4_ * auVar125._0_4_;
                            auVar178._4_4_ = auVar118._4_4_ * auVar125._4_4_;
                            auVar178._8_4_ = auVar118._8_4_ * auVar125._8_4_;
                            auVar178._12_4_ = auVar118._12_4_ * auVar125._12_4_;
                            auVar61 = vfmadd231ps_fma(auVar178,auVar116,auVar36);
                            auVar222._0_4_ = auVar36._0_4_ * auVar80._0_4_;
                            auVar222._4_4_ = auVar36._4_4_ * auVar80._4_4_;
                            auVar222._8_4_ = auVar36._8_4_ * auVar80._8_4_;
                            auVar222._12_4_ = auVar36._12_4_ * auVar80._12_4_;
                            auVar209 = vfmsub231ps_fma(auVar222,auVar79,auVar118);
                            auVar229._0_4_ = auVar118._0_4_ * auVar38._0_4_;
                            auVar229._4_4_ = auVar118._4_4_ * auVar38._4_4_;
                            auVar229._8_4_ = auVar118._8_4_ * auVar38._8_4_;
                            auVar229._12_4_ = auVar118._12_4_ * auVar38._12_4_;
                            auVar217 = vfmsub231ps_fma(auVar229,auVar80,auVar54);
                            auVar118 = vfmadd231ps_fma(auVar61,auVar84,auVar54);
                            auVar43._0_4_ = auVar37._0_4_ * auVar199._0_4_;
                            auVar43._4_4_ = auVar37._4_4_ * auVar199._4_4_;
                            auVar43._8_4_ = auVar37._8_4_ * auVar199._8_4_;
                            auVar43._12_4_ = auVar37._12_4_ * auVar199._12_4_;
                            auVar36 = vfmadd231ps_fma(auVar43,auVar217,auVar192);
                            auVar54 = vandps_avx(auVar118,auVar59);
                            auVar36 = vfmadd231ps_fma(auVar36,auVar209,auVar191);
                            uVar20 = auVar54._0_4_;
                            auVar124._0_4_ = (float)(uVar20 ^ auVar36._0_4_);
                            uVar200 = auVar54._4_4_;
                            auVar124._4_4_ = (float)(uVar200 ^ auVar36._4_4_);
                            uVar202 = auVar54._8_4_;
                            auVar124._8_4_ = (float)(uVar202 ^ auVar36._8_4_);
                            uVar204 = auVar54._12_4_;
                            auVar124._12_4_ = (float)(uVar204 ^ auVar36._12_4_);
                            auVar67 = ZEXT1664(auVar57);
                            auVar54 = vcmpps_avx(auVar124,_DAT_01feba10,5);
                            auVar36 = auVar57 & auVar54;
                            if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 && (auVar36 >> 0x3f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                (auVar36 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                && -1 < auVar36[0xf]) {
                              auVar223 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                              auVar57 = vpcmpeqd_avx(auVar116,auVar116);
                              auVar89 = ZEXT1664(auVar57);
                            }
                            else {
                              auVar54 = vandps_avx(auVar54,auVar57);
                              auVar45._0_4_ = auVar133._0_4_ * auVar199._0_4_;
                              auVar45._4_4_ = auVar133._4_4_ * auVar199._4_4_;
                              auVar45._8_4_ = auVar133._8_4_ * auVar199._8_4_;
                              auVar45._12_4_ = auVar133._12_4_ * auVar199._12_4_;
                              auVar36 = vfmadd213ps_fma(auVar132,auVar217,auVar45);
                              auVar36 = vfmadd213ps_fma(auVar119,auVar209,auVar36);
                              auVar156._0_4_ = (float)(uVar20 ^ auVar36._0_4_);
                              auVar156._4_4_ = (float)(uVar200 ^ auVar36._4_4_);
                              auVar156._8_4_ = (float)(uVar202 ^ auVar36._8_4_);
                              auVar156._12_4_ = (float)(uVar204 ^ auVar36._12_4_);
                              auVar36 = vcmpps_avx(auVar156,_DAT_01feba10,5);
                              auVar119 = auVar54 & auVar36;
                              if ((((auVar119 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0 &&
                                   (auVar119 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar119 >> 0x5f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) && -1 < auVar119[0xf]) {
                                auVar223 = ZEXT1664(CONCAT412(0x7f800000,
                                                              CONCAT48(0x7f800000,0x7f8000007f800000
                                                                      )));
                                auVar54 = vpcmpeqd_avx(auVar116,auVar116);
                                auVar89 = ZEXT1664(auVar54);
                                auVar67 = ZEXT1664(auVar57);
                              }
                              else {
                                auVar86 = vandps_avx(auVar118,auVar207);
                                auVar54 = vandps_avx(auVar36,auVar54);
                                auVar36 = vsubps_avx(auVar86,auVar124);
                                auVar36 = vcmpps_avx(auVar36,auVar156,5);
                                auVar119 = auVar54 & auVar36;
                                if ((((auVar119 >> 0x1f & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar119 >> 0x3f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar119 >> 0x5f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) && -1 < auVar119[0xf]) {
LAB_005473e7:
                                  auVar54 = vpcmpeqd_avx(auVar86,auVar86);
                                }
                                else {
                                  auVar54 = vandps_avx(auVar36,auVar54);
                                  auVar49._0_4_ = auVar80._0_4_ * auVar125._0_4_;
                                  auVar49._4_4_ = auVar80._4_4_ * auVar125._4_4_;
                                  auVar49._8_4_ = auVar80._8_4_ * auVar125._8_4_;
                                  auVar49._12_4_ = auVar80._12_4_ * auVar125._12_4_;
                                  auVar36 = vfmadd132ps_fma(auVar79,auVar49,auVar116);
                                  auVar36 = vfmadd132ps_fma(auVar38,auVar36,auVar84);
                                  auVar142._0_4_ = (float)(uVar20 ^ auVar36._0_4_);
                                  auVar142._4_4_ = (float)(uVar200 ^ auVar36._4_4_);
                                  auVar142._8_4_ = (float)(uVar202 ^ auVar36._8_4_);
                                  auVar142._12_4_ = (float)(uVar204 ^ auVar36._12_4_);
                                  auVar50._0_4_ = auVar86._0_4_ * *(float *)(ray + 0x30);
                                  auVar50._4_4_ = auVar86._4_4_ * *(float *)(ray + 0x34);
                                  auVar50._8_4_ = auVar86._8_4_ * *(float *)(ray + 0x38);
                                  auVar50._12_4_ = auVar86._12_4_ * *(float *)(ray + 0x3c);
                                  auVar36 = vcmpps_avx(auVar50,auVar142,1);
                                  auVar132 = *(undefined1 (*) [16])(ray + 0x80);
                                  auVar169._0_4_ = auVar86._0_4_ * *(float *)(ray + 0x80);
                                  auVar169._4_4_ = auVar86._4_4_ * *(float *)(ray + 0x84);
                                  auVar169._8_4_ = auVar86._8_4_ * *(float *)(ray + 0x88);
                                  auVar169._12_4_ = auVar86._12_4_ * *(float *)(ray + 0x8c);
                                  auVar119 = vcmpps_avx(auVar142,auVar169,2);
                                  auVar36 = vandps_avx(auVar119,auVar36);
                                  auVar119 = auVar54 & auVar36;
                                  if ((((auVar119 >> 0x1f & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar119 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar119 >> 0x5f & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) && -1 < auVar119[0xf])
                                  goto LAB_005473e7;
                                  auVar54 = vandps_avx(auVar54,auVar36);
                                  auVar36 = vcmpps_avx(auVar118,_DAT_01feba10,4);
                                  auVar118 = auVar54 & auVar36;
                                  if ((((auVar118 >> 0x1f & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar118 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar118 >> 0x5f & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) && -1 < auVar118[0xf])
                                  goto LAB_005473e7;
                                  auVar54 = vandps_avx(auVar36,auVar54);
                                  pGVar5 = (context->scene->geometries).items
                                           [*(uint *)(lVar32 + 0x40 + uVar25 * 4)].ptr;
                                  uVar20 = pGVar5->mask;
                                  auVar51._4_4_ = uVar20;
                                  auVar51._0_4_ = uVar20;
                                  auVar51._8_4_ = uVar20;
                                  auVar51._12_4_ = uVar20;
                                  auVar36 = vpand_avx(auVar51,*(undefined1 (*) [16])(ray + 0x90));
                                  auVar36 = vpcmpeqd_avx(auVar36,_DAT_01feba10);
                                  auVar118 = auVar54 & ~auVar36;
                                  if ((((auVar118 >> 0x1f & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar118 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar118 >> 0x5f & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) && -1 < auVar118[0xf])
                                  goto LAB_005473e7;
                                  aVar171 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                            vandnps_avx(auVar36,auVar54);
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    auVar54 = vrcpps_avx(auVar86);
                                    auVar180._8_4_ = 0x3f800000;
                                    auVar180._0_8_ = &DAT_3f8000003f800000;
                                    auVar180._12_4_ = 0x3f800000;
                                    auVar36 = vfnmadd213ps_fma(auVar86,auVar54,auVar180);
                                    auVar86 = vfmadd132ps_fma(auVar36,auVar54,auVar54);
                                    fVar77 = auVar86._0_4_;
                                    auVar53._0_4_ = fVar77 * auVar124._0_4_;
                                    fVar96 = auVar86._4_4_;
                                    auVar53._4_4_ = fVar96 * auVar124._4_4_;
                                    fVar103 = auVar86._8_4_;
                                    auVar53._8_4_ = fVar103 * auVar124._8_4_;
                                    fVar110 = auVar86._12_4_;
                                    auVar53._12_4_ = fVar110 * auVar124._12_4_;
                                    auVar54 = vminps_avx(auVar53,auVar180);
                                    auVar127._0_4_ = fVar77 * auVar156._0_4_;
                                    auVar127._4_4_ = fVar96 * auVar156._4_4_;
                                    auVar127._8_4_ = fVar103 * auVar156._8_4_;
                                    auVar127._12_4_ = fVar110 * auVar156._12_4_;
                                    auVar36 = vminps_avx(auVar127,auVar180);
                                    auVar118 = vsubps_avx(auVar180,auVar54);
                                    auVar119 = vsubps_avx(auVar180,auVar36);
                                    auVar54 = vblendvps_avx(auVar54,auVar118,auVar8);
                                    vblendvps_avx(auVar36,auVar119,auVar8);
                                    local_1998 = auVar84._0_8_;
                                    uStack_1990 = auVar84._8_8_;
                                    p0.field_0._0_8_ = local_1998;
                                    p0.field_0._8_8_ = uStack_1990;
                                    local_19f8 = auVar116._0_8_;
                                    uStack_19f0 = auVar116._8_8_;
                                    p0.field_0._16_8_ = local_19f8;
                                    p0.field_0._24_8_ = uStack_19f0;
                                    local_1a08 = auVar125._0_8_;
                                    uStack_1a00 = auVar125._8_8_;
                                    p0.field_0._32_8_ = local_1a08;
                                    p0.field_0._40_8_ = uStack_1a00;
                                    vpcmpeqd_avx2(ZEXT1632(auVar54),ZEXT1632(auVar54));
                                    auVar65._0_4_ = fVar77 * auVar142._0_4_;
                                    auVar65._4_4_ = fVar96 * auVar142._4_4_;
                                    auVar65._8_4_ = fVar103 * auVar142._8_4_;
                                    auVar65._12_4_ = fVar110 * auVar142._12_4_;
                                    auVar54 = vblendvps_avx(auVar132,auVar65,
                                                            (undefined1  [16])aVar171);
                                    *(undefined1 (*) [16])(ray + 0x80) = auVar54;
                                    itime.field_0 = aVar171;
                                    p1.field_0._0_8_ = &itime;
                                    p1.field_0._8_8_ = pGVar5->userPtr;
                                    p1.field_0._16_8_ = context->user;
                                    p1.field_0._24_8_ = ray;
                                    p1.field_0._32_8_ = &p0;
                                    p1.field_0._40_4_ = 4;
                                    if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                      (*pGVar5->occlusionFilterN)
                                                ((RTCFilterFunctionNArguments *)&p1);
                                    }
                                    if (itime.field_0 ==
                                        (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                      auVar54 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                                      auVar54 = auVar54 ^ _DAT_01febe20;
                                    }
                                    else {
                                      p_Var7 = context->args->filter;
                                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                         (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                        (*p_Var7)((RTCFilterFunctionNArguments *)&p1);
                                      }
                                      auVar36 = vpcmpeqd_avx((undefined1  [16])0x0,
                                                             (undefined1  [16])itime.field_0);
                                      auVar54 = auVar36 ^ _DAT_01febe20;
                                      auVar86._8_4_ = 0xff800000;
                                      auVar86._0_8_ = 0xff800000ff800000;
                                      auVar86._12_4_ = 0xff800000;
                                      auVar36 = vblendvps_avx(auVar86,*(undefined1 (*) [16])
                                                                       (p1.field_0._24_8_ + 0x80),
                                                              auVar36);
                                      *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar36;
                                    }
                                    auVar54 = vpslld_avx(auVar54,0x1f);
                                    aVar171 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                              vpsrad_avx(auVar54,0x1f);
                                    auVar54 = vblendvps_avx(auVar132,*(undefined1 (*) [16])pRVar1,
                                                            auVar54);
                                    *(undefined1 (*) [16])pRVar1 = auVar54;
                                  }
                                  auVar57 = vpandn_avx((undefined1  [16])aVar171,auVar57);
                                  auVar54 = vpcmpeqd_avx(auVar86,auVar86);
                                }
                                auVar223 = ZEXT1664(CONCAT412(0x7f800000,
                                                              CONCAT48(0x7f800000,0x7f8000007f800000
                                                                      )));
                                auVar89 = ZEXT1664(auVar54);
                                auVar67 = ZEXT1664(auVar57);
                              }
                            }
                            auVar57 = auVar67._0_16_;
                            bVar35 = (((auVar57 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0 ||
                                      (auVar57 >> 0x3f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                     (auVar57 >> 0x5f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) || auVar67[0xf] < '\0';
                          }
                          auVar57 = auVar67._0_16_;
                          if ((!bVar35) || (bVar35 = 2 < uVar25, uVar25 = uVar25 + 1, bVar35))
                          break;
                        }
                        auVar67 = ZEXT1664(auVar57);
                        auVar54 = vandps_avx(auVar57,auVar88);
                        auVar88 = auVar88 & auVar57;
                      } while (((((auVar88 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 || (auVar88 >> 0x3f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                (auVar88 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || auVar88[0xf] < '\0') &&
                              (uVar22 = uVar22 + 1, auVar88 = auVar54, uVar22 < uVar26 - 8));
                      aVar55._0_4_ = auVar54._0_4_ ^ auVar89._0_4_;
                      aVar55._4_4_ = auVar54._4_4_ ^ auVar89._4_4_;
                      aVar55._8_4_ = auVar54._8_4_ ^ auVar89._8_4_;
                      aVar55._12_4_ = auVar54._12_4_ ^ auVar89._12_4_;
                    }
                    terminated.field_0 =
                         (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                         vorps_avx((undefined1  [16])aVar55,(undefined1  [16])terminated.field_0);
                    auVar88 = auVar89._0_16_ & ~(undefined1  [16])terminated.field_0;
                    if ((((auVar88 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar88 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar88 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar88[0xf]) goto LAB_00547a72;
                    auVar67 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
                    auVar87._8_4_ = 0xff800000;
                    auVar87._0_8_ = 0xff800000ff800000;
                    auVar87._12_4_ = 0xff800000;
                    auVar89 = ZEXT1664(auVar87);
                    tray.tfar.field_0 =
                         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar87,
                                       (undefined1  [16])terminated.field_0);
                    iVar21 = 0;
                    break;
                  }
                  goto LAB_00547a83;
                }
                uVar22 = root.ptr & 0xfffffffffffffff0;
                auVar88 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar230._0_16_,6);
                auVar230 = ZEXT1664(auVar223._0_16_);
                uVar26 = 0;
                root.ptr = 8;
                do {
                  sVar4 = *(size_t *)(uVar22 + uVar26 * 8);
                  if (sVar4 != 8) {
                    uVar24 = *(undefined4 *)(uVar22 + 0x80 + uVar26 * 4);
                    auVar111._4_4_ = uVar24;
                    auVar111._0_4_ = uVar24;
                    auVar111._8_4_ = uVar24;
                    auVar111._12_4_ = uVar24;
                    uVar24 = *(undefined4 *)(uVar22 + 0x20 + uVar26 * 4);
                    auVar78._4_4_ = uVar24;
                    auVar78._0_4_ = uVar24;
                    auVar78._8_4_ = uVar24;
                    auVar78._12_4_ = uVar24;
                    auVar57 = *(undefined1 (*) [16])(ray + 0x70);
                    auVar54 = vfmadd231ps_fma(auVar78,auVar57,auVar111);
                    uVar24 = *(undefined4 *)(uVar22 + 0xa0 + uVar26 * 4);
                    auVar120._4_4_ = uVar24;
                    auVar120._0_4_ = uVar24;
                    auVar120._8_4_ = uVar24;
                    auVar120._12_4_ = uVar24;
                    uVar24 = *(undefined4 *)(uVar22 + 0x40 + uVar26 * 4);
                    auVar112._4_4_ = uVar24;
                    auVar112._0_4_ = uVar24;
                    auVar112._8_4_ = uVar24;
                    auVar112._12_4_ = uVar24;
                    auVar36 = vfmadd231ps_fma(auVar112,auVar57,auVar120);
                    uVar24 = *(undefined4 *)(uVar22 + 0xc0 + uVar26 * 4);
                    auVar134._4_4_ = uVar24;
                    auVar134._0_4_ = uVar24;
                    auVar134._8_4_ = uVar24;
                    auVar134._12_4_ = uVar24;
                    uVar24 = *(undefined4 *)(uVar22 + 0x60 + uVar26 * 4);
                    auVar121._4_4_ = uVar24;
                    auVar121._0_4_ = uVar24;
                    auVar121._8_4_ = uVar24;
                    auVar121._12_4_ = uVar24;
                    auVar118 = vfmadd231ps_fma(auVar121,auVar57,auVar134);
                    uVar24 = *(undefined4 *)(uVar22 + 0x90 + uVar26 * 4);
                    auVar147._4_4_ = uVar24;
                    auVar147._0_4_ = uVar24;
                    auVar147._8_4_ = uVar24;
                    auVar147._12_4_ = uVar24;
                    uVar24 = *(undefined4 *)(uVar22 + 0x30 + uVar26 * 4);
                    auVar135._4_4_ = uVar24;
                    auVar135._0_4_ = uVar24;
                    auVar135._8_4_ = uVar24;
                    auVar135._12_4_ = uVar24;
                    auVar119 = vfmadd231ps_fma(auVar135,auVar57,auVar147);
                    uVar24 = *(undefined4 *)(uVar22 + 0xb0 + uVar26 * 4);
                    auVar148._4_4_ = uVar24;
                    auVar148._0_4_ = uVar24;
                    auVar148._8_4_ = uVar24;
                    auVar148._12_4_ = uVar24;
                    uVar24 = *(undefined4 *)(uVar22 + 0x50 + uVar26 * 4);
                    auVar161._4_4_ = uVar24;
                    auVar161._0_4_ = uVar24;
                    auVar161._8_4_ = uVar24;
                    auVar161._12_4_ = uVar24;
                    auVar132 = vfmadd231ps_fma(auVar161,auVar57,auVar148);
                    uVar24 = *(undefined4 *)(uVar22 + 0xd0 + uVar26 * 4);
                    auVar149._4_4_ = uVar24;
                    auVar149._0_4_ = uVar24;
                    auVar149._8_4_ = uVar24;
                    auVar149._12_4_ = uVar24;
                    uVar24 = *(undefined4 *)(uVar22 + 0x70 + uVar26 * 4);
                    auVar176._4_4_ = uVar24;
                    auVar176._0_4_ = uVar24;
                    auVar176._8_4_ = uVar24;
                    auVar176._12_4_ = uVar24;
                    auVar133 = vfmadd231ps_fma(auVar176,auVar57,auVar149);
                    auVar15._4_4_ = tray.org_rdir.field_0._4_4_;
                    auVar15._0_4_ = tray.org_rdir.field_0._0_4_;
                    auVar15._8_4_ = tray.org_rdir.field_0._8_4_;
                    auVar15._12_4_ = tray.org_rdir.field_0._12_4_;
                    auVar191 = vfmsub213ps_fma(auVar54,(undefined1  [16])
                                                       tray.rdir.field_0.field_0.x.field_0,auVar15);
                    auVar16._4_4_ = tray.org_rdir.field_0._20_4_;
                    auVar16._0_4_ = tray.org_rdir.field_0._16_4_;
                    auVar16._8_4_ = tray.org_rdir.field_0._24_4_;
                    auVar16._12_4_ = tray.org_rdir.field_0._28_4_;
                    auVar192 = vfmsub213ps_fma(auVar36,(undefined1  [16])
                                                       tray.rdir.field_0.field_0.y.field_0,auVar16);
                    auVar17._4_4_ = tray.org_rdir.field_0._36_4_;
                    auVar17._0_4_ = tray.org_rdir.field_0._32_4_;
                    auVar17._8_4_ = tray.org_rdir.field_0._40_4_;
                    auVar17._12_4_ = tray.org_rdir.field_0._44_4_;
                    auVar37 = vfmsub213ps_fma(auVar118,(undefined1  [16])
                                                       tray.rdir.field_0.field_0.z.field_0,auVar17);
                    auVar118 = vfmsub213ps_fma(auVar119,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.x.field_0,auVar15)
                    ;
                    auVar119 = vfmsub213ps_fma(auVar132,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.y.field_0,auVar16)
                    ;
                    auVar132 = vfmsub213ps_fma(auVar133,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.z.field_0,auVar17)
                    ;
                    auVar54 = vpminsd_avx(auVar191,auVar118);
                    auVar36 = vpminsd_avx(auVar192,auVar119);
                    auVar54 = vpmaxsd_avx(auVar54,auVar36);
                    auVar36 = vpminsd_avx(auVar37,auVar132);
                    auVar36 = vpmaxsd_avx(auVar54,auVar36);
                    auVar54 = vpmaxsd_avx(auVar191,auVar118);
                    auVar118 = vpmaxsd_avx(auVar192,auVar119);
                    auVar119 = vpminsd_avx(auVar54,auVar118);
                    auVar118 = vpmaxsd_avx(auVar37,auVar132);
                    auVar54 = vpmaxsd_avx(auVar36,(undefined1  [16])tray.tnear.field_0);
                    auVar118 = vpminsd_avx(auVar119,auVar118);
                    auVar118 = vpminsd_avx(auVar118,(undefined1  [16])tray.tfar.field_0);
                    if ((uVar20 & 7) == 6) {
                      auVar54 = vcmpps_avx(auVar54,auVar118,2);
                      uVar24 = *(undefined4 *)(uVar22 + 0xe0 + uVar26 * 4);
                      auVar113._4_4_ = uVar24;
                      auVar113._0_4_ = uVar24;
                      auVar113._8_4_ = uVar24;
                      auVar113._12_4_ = uVar24;
                      auVar118 = vcmpps_avx(auVar113,auVar57,2);
                      uVar24 = *(undefined4 *)(uVar22 + 0xf0 + uVar26 * 4);
                      auVar122._4_4_ = uVar24;
                      auVar122._0_4_ = uVar24;
                      auVar122._8_4_ = uVar24;
                      auVar122._12_4_ = uVar24;
                      auVar57 = vcmpps_avx(auVar57,auVar122,1);
                      auVar57 = vandps_avx(auVar118,auVar57);
                      auVar57 = vandps_avx(auVar57,auVar54);
                    }
                    else {
                      auVar57 = vcmpps_avx(auVar54,auVar118,2);
                    }
                    auVar89 = ZEXT1664(auVar54);
                    auVar57 = vandps_avx(auVar57,auVar88);
                    auVar57 = vpslld_avx(auVar57,0x1f);
                    auVar67 = ZEXT1664(auVar57);
                    if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar57[0xf] < '\0') {
                      auVar57 = vblendvps_avx(auVar223._0_16_,auVar36,auVar57);
                      auVar67 = ZEXT1664(auVar57);
                      if (root.ptr != 8) {
                        pNVar34->ptr = root.ptr;
                        pNVar34 = pNVar34 + 1;
                        *paVar33 = auVar230._0_16_;
                        paVar33 = paVar33 + 1;
                      }
                      auVar230 = ZEXT1664(auVar57);
                      root.ptr = sVar4;
                    }
                  }
                } while ((sVar4 != 8) && (bVar35 = uVar26 < 3, uVar26 = uVar26 + 1, bVar35));
                iVar21 = 0;
                if (root.ptr == 8) {
LAB_005469d7:
                  bVar35 = false;
                  iVar21 = 4;
                }
                else {
                  auVar88 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                       (undefined1  [16])auVar230._0_16_,6);
                  uVar24 = vmovmskps_avx(auVar88);
                  bVar35 = true;
                  if ((uint)POPCOUNT(uVar24) <= uVar29) {
                    pNVar34->ptr = root.ptr;
                    pNVar34 = pNVar34 + 1;
                    *paVar33 = auVar230._0_16_;
                    paVar33 = paVar33 + 1;
                    goto LAB_005469d7;
                  }
                }
              } while (bVar35);
            }
          }
        }
      } while (iVar21 != 3);
      auVar8 = vandps_avx(auVar66,(undefined1  [16])terminated.field_0);
      auVar66._8_4_ = 0xff800000;
      auVar66._0_8_ = 0xff800000ff800000;
      auVar66._12_4_ = 0xff800000;
      auVar8 = vmaskmovps_avx(auVar8,auVar66);
      *(undefined1 (*) [16])pRVar1 = auVar8;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }